

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastGdS2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort uVar1;
  uint32_t uVar2;
  bool bVar3;
  uint uVar4;
  TcParseTableBase *pTVar5;
  MessageLite *pMVar6;
  ulong uVar7;
  ushort *puVar8;
  char *pcVar9;
  ushort *puVar10;
  Nonnull<const_char_*> failure_msg;
  int iVar11;
  TcParseTableBase *unaff_RBX;
  long *plVar12;
  Arena *arena;
  uint *puVar13;
  MessageLite *unaff_R15;
  LogMessageFatal local_50;
  long local_40;
  long local_38;
  
  if (data.field_0._0_2_ != 0) {
    pcVar9 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar9;
  }
  uVar1 = *(ushort *)ptr;
  if ((ulong)table->has_bits_offset != 0) {
    puVar13 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar13 & 3) != 0) {
      AlignFail();
    }
    *puVar13 = *puVar13 | (uint)hasbits | (uint)(1L << (data.field_0._2_1_ & 0x3f));
  }
  plVar12 = (long *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)plVar12 & 7) != 0) {
    AlignFail(plVar12);
  }
  pTVar5 = MessageLite::GetTcParseTable
                     (*(MessageLite **)
                       ((long)&table->has_bits_offset +
                       ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset));
  if (*plVar12 == 0) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pMVar6 = ClassData::New(pTVar5->class_data,arena);
    *plVar12 = (long)pMVar6;
  }
  iVar11 = ctx->depth_;
  local_38 = (long)iVar11 + -1;
  ctx->depth_ = (int)local_38;
  if ((long)iVar11 < 1) {
    puVar8 = (ushort *)0x0;
  }
  else {
    local_50.super_LogMessage._0_8_ = ptr + 2;
    local_40 = (long)ctx->group_depth_ + 1;
    ctx->group_depth_ = (int)local_40;
    pMVar6 = (MessageLite *)*plVar12;
    while (bVar3 = EpsCopyInputStream::DoneWithCheck<false>
                             (&ctx->super_EpsCopyInputStream,(char **)&local_50,ctx->group_depth_),
          !bVar3) {
      uVar4 = (uint)pTVar5->fast_idx_mask & (uint)*(ushort *)local_50.super_LogMessage._0_8_;
      if ((uVar4 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      uVar7 = (ulong)(uVar4 & 0xfffffff8);
      local_50.super_LogMessage._0_8_ =
           (**(code **)(&pTVar5[1].has_bits_offset + uVar7))
                     (pMVar6,local_50.super_LogMessage._0_8_,ctx,
                      (ulong)*(ushort *)local_50.super_LogMessage._0_8_ ^
                      *(ulong *)(&pTVar5[1].fast_idx_mask + uVar7 * 2),pTVar5,0);
      if (((ushort *)local_50.super_LogMessage._0_8_ == (ushort *)0x0) ||
         ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)) break;
    }
    if ((pTVar5->field_0x9 & 1) == 0) {
      puVar10 = (ushort *)local_50.super_LogMessage._0_8_;
      if ((ushort *)local_50.super_LogMessage._0_8_ == (ushort *)0x0) {
        VerifyHasBitConsistency(unaff_R15,unaff_RBX);
        puVar10 = (ushort *)local_50.super_LogMessage._0_8_;
      }
    }
    else {
      puVar10 = (ushort *)
                (*pTVar5->post_loop_handler)(pMVar6,(char *)local_50.super_LogMessage._0_8_,ctx);
    }
    if (puVar10 != (ushort *)0x0) {
      if ((int)local_38 == ctx->depth_) {
        failure_msg = (Nonnull<const_char_*>)0x0;
      }
      else {
        failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (local_38,(long)ctx->depth_,"old_depth == depth_");
      }
      if (failure_msg != (Nonnull<const_char_*>)0x0) {
        iVar11 = 0x491;
LAB_002c20b4:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_50,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                   ,iVar11,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_50);
      }
      if ((int)local_40 == ctx->group_depth_) {
        failure_msg = (Nonnull<const_char_*>)0x0;
      }
      else {
        failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (local_40,(long)ctx->group_depth_,"old_group_depth == group_depth_")
        ;
      }
      if (failure_msg != (Nonnull<const_char_*>)0x0) {
        iVar11 = 0x492;
        goto LAB_002c20b4;
      }
    }
    ctx->group_depth_ = ctx->group_depth_ + -1;
    ctx->depth_ = ctx->depth_ + 1;
    uVar2 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    puVar8 = (ushort *)0x0;
    if (uVar2 == (int)(char)uVar1 + (uint)uVar1 >> 1) {
      puVar8 = puVar10;
    }
  }
  return (char *)puVar8;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGdS2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint16_t, true, false>(
      PROTOBUF_TC_PARAM_PASS);
}